

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O3

int __thiscall
NaDynAr<NaPetriConnector_*>::insert
          (NaDynAr<NaPetriConnector_*> *this,int index,NaPetriConnector **pobj)

{
  item **ppiVar1;
  int iVar2;
  item *piVar3;
  undefined4 *puVar4;
  item *piVar5;
  int iVar6;
  item *piVar7;
  int iVar8;
  
  if (pobj == (NaPetriConnector **)0x0) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 0;
    __cxa_throw(puVar4,&NaException::typeinfo,0);
  }
  piVar3 = (item *)operator_new(0x10);
  piVar3->pData = pobj;
  piVar3->pNext = (item *)0x0;
  iVar2 = this->nItems;
  iVar6 = index;
  if (iVar2 == index) {
    this->pTail->pNext = piVar3;
    piVar3->pNext = (item *)0x0;
    goto LAB_001444ee;
  }
  if (index < iVar2 && -1 < index) {
    piVar5 = this->pHead;
    piVar7 = piVar5;
    iVar8 = index;
    if (index == 0) {
      piVar3->pNext = piVar5;
LAB_001444ea:
      this->pHead = piVar3;
      goto LAB_001444ee;
    }
    do {
      ppiVar1 = &piVar7->pNext;
      iVar8 = iVar8 + -1;
      piVar7 = *ppiVar1;
    } while (iVar8 != 0);
    piVar3->pNext = *ppiVar1;
  }
  else {
    if (index == 0) goto LAB_001444ea;
    piVar5 = this->pHead;
  }
  while (index = index + -1, index != 0) {
    piVar5 = piVar5->pNext;
  }
  piVar5->pNext = piVar3;
LAB_001444ee:
  this->nItems = iVar2 + 1;
  return iVar6;
}

Assistant:

virtual int   insert (int index, type* pobj) {
    if(NULL == pobj)
      throw(na_null_pointer);

    item  *p = new item(pobj);

#ifdef DynAr_DEBUG
    NaPrintLog("DynAr::insert(this=0x%08p), %d items, new item=0x%08p at %d\n",
	       this, nItems, p, index);
#endif /* DynAr_DEBUG */

    if(nItems == index){
      pTail->pNext = p;
      p->pNext = NULL;
    }
    else{
      item    *pNext = fetch_item(index);
      p->pNext = pNext;
      if(0 == index)
	pHead = p;
      else
	fetch_item(index - 1)->pNext = p;
    }
    ++nItems;

    return index;
  }